

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O1

size_t x11_send(Channel *chan,_Bool is_stderr,void *vdata,size_t len)

{
  undefined1 *puVar1;
  undefined1 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int port;
  ChannelVtable *__s1;
  long *blk;
  bool bVar8;
  _Bool _Var9;
  int iVar10;
  ulong uVar11;
  ChannelVtable *pCVar12;
  void *pvVar13;
  size_t sVar14;
  undefined8 *puVar15;
  int *piVar16;
  long lVar17;
  time_t tVar18;
  SockAddr *addr;
  Conf *conf;
  byte *pbVar19;
  uint *puVar20;
  uint *puVar21;
  char *pcVar22;
  uint uVar23;
  int iVar24;
  int socketdatalen;
  ulong local_c0;
  unsigned_long peer_ip;
  int greeting_len;
  char new_peer_addr [32];
  undefined4 local_80 [2];
  undefined8 local_78;
  int local_70;
  undefined8 local_58 [5];
  
  if (chan->vt != &X11Connection_channelvt) {
    __assert_fail("chan->vt == &X11Connection_channelvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c",
                  0x1ce,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
  }
  if (len != 0) {
    do {
      iVar24 = *(int *)&chan[-4].vt;
      if (0xb < (long)iVar24) goto LAB_0010d63a;
      puVar1 = (undefined1 *)((long)vdata + 1);
      uVar2 = *vdata;
      *(int *)&chan[-4].vt = iVar24 + 1;
      *(undefined1 *)((long)&chan[-7].vt + (long)iVar24) = uVar2;
      len = len - 1;
      vdata = puVar1;
    } while (len != 0);
    len = 0;
  }
LAB_0010d63a:
  if (*(int *)&chan[-4].vt < 0xc) {
    return 0;
  }
  if (chan[-5].vt == (ChannelVtable *)0x0) {
    uVar11 = (ulong)(*(char *)&chan[-7].vt == 'B');
    bVar3 = *(byte *)((long)chan + (uVar11 - 0x6a));
    bVar4 = *(byte *)((long)&chan->vt + (uVar11 ^ 0xffffffffffffff97));
    *(uint *)((long)&chan[-4].vt + 4) = (uint)bVar4 * 0x100 + (uint)bVar3;
    bVar5 = *(byte *)((long)chan + (uVar11 - 0x68));
    bVar6 = *(byte *)((long)&chan->vt + (uVar11 ^ 0xffffffffffffff99));
    *(uint *)&chan[-4].field_0xc = (uint)bVar6 * 0x100 + (uint)bVar5;
    uVar23 = CONCAT11(bVar4,bVar3) + 3 & 0xfffffffc;
    chan[-4].initial_fixed_window_size = uVar23;
    *(uint *)&chan[-3].vt = CONCAT11(bVar6,bVar5) + 3 & 0xfffffffc;
    pCVar12 = (ChannelVtable *)safemalloc((ulong)(uVar23 + 1),1,0);
    chan[-5].vt = pCVar12;
    pvVar13 = safemalloc((long)*(int *)&chan[-3].vt,1,0);
    *(void **)&chan[-5].initial_fixed_window_size = pvVar13;
  }
  if (len != 0) {
    do {
      iVar24 = *(int *)&chan[-4].vt;
      if ((int)(chan[-4].initial_fixed_window_size + 0xc) <= iVar24) goto LAB_0010d704;
      puVar1 = (undefined1 *)((long)vdata + 1);
      uVar2 = *vdata;
      *(int *)&chan[-4].vt = iVar24 + 1;
      *(undefined1 *)((long)chan[-5].vt + (long)iVar24 + -0xc) = uVar2;
      len = len - 1;
      vdata = puVar1;
    } while (len != 0);
    len = 0;
  }
LAB_0010d704:
  if (len != 0) {
    do {
      iVar24 = *(int *)&chan[-4].vt;
      if ((int)(*(int *)&chan[-3].vt + chan[-4].initial_fixed_window_size + 0xc) <= iVar24)
      goto LAB_0010d749;
      puVar1 = (undefined1 *)((long)vdata + 1);
      uVar2 = *vdata;
      lVar17 = *(long *)&chan[-5].initial_fixed_window_size;
      *(int *)&chan[-4].vt = iVar24 + 1;
      *(undefined1 *)(lVar17 + (int)((iVar24 - chan[-4].initial_fixed_window_size) + -0xc)) = uVar2;
      len = len - 1;
      vdata = puVar1;
    } while (len != 0);
    len = 0;
  }
LAB_0010d749:
  if (*(int *)&chan[-4].vt < (int)(chan[-4].initial_fixed_window_size + *(int *)&chan[-3].vt + 0xc))
  {
    return 0;
  }
  if (*(char *)((long)&chan[-3].vt + 4) != '\0') goto LAB_0010d767;
  if (chan[-1].vt != (ChannelVtable *)0x0) {
    __assert_fail("!xconn->s",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c",
                  0x20a,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
  }
  uVar11 = (ulong)(*(char *)&chan[-7].vt == 'B');
  bVar3 = *(byte *)((long)chan + (uVar11 - 0x6e));
  bVar4 = *(byte *)((long)&chan->vt + (uVar11 ^ 0xffffffffffffff93));
  bVar5 = *(byte *)((long)chan + (uVar11 - 0x6c));
  bVar6 = *(byte *)((long)&chan->vt + (uVar11 ^ 0xffffffffffffff95));
  *(undefined1 *)((long)&(chan[-5].vt)->free + (long)*(int *)((long)&chan[-4].vt + 4)) = 0;
  peer_ip = 0;
  _Var9 = x11_parse_ip(*(char **)&chan[-3].initial_fixed_window_size,&peer_ip);
  uVar23 = 0xffffffff;
  if (_Var9) {
    uVar23 = *(uint *)&chan[-2].vt;
  }
  local_c0 = peer_ip;
  pCVar12 = chan[-6].vt;
  __s1 = chan[-5].vt;
  blk = *(long **)&chan[-5].initial_fixed_window_size;
  iVar24 = *(int *)&chan[-4].field_0xc;
  iVar10 = strcmp((char *)__s1,"MIT-MAGIC-COOKIE-1");
  if (iVar10 == 0) {
    puVar15 = &local_78;
    local_80[0] = 1;
    local_70 = iVar24;
LAB_0010d873:
    *puVar15 = blk;
    piVar16 = (int *)find234((tree234 *)pCVar12,local_80,(cmpfn234)0x0);
    if (piVar16 == (int *)0x0) {
      pcVar22 = "Authorisation not recognised";
      goto LAB_0010d97d;
    }
    if (*piVar16 == 2) {
      if (iVar24 == 0x18) {
        if (uVar23 == 0xffffffff) {
          pcVar22 = "cannot do XDM-AUTHORIZATION-1 without remote address data";
          goto LAB_0010d971;
        }
        des_decrypt_xdmauth((void *)(*(long *)(piVar16 + 2) + 9),blk,0x18);
        pcVar22 = "XDM-AUTHORIZATION-1 data failed check";
        if (((**(long **)(piVar16 + 2) != *blk) ||
            (uVar7 = *(uint *)(blk + 1),
            (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18) !=
            local_c0)) ||
           ((ushort)(*(ushort *)((long)blk + 0xc) << 8 | *(ushort *)((long)blk + 0xc) >> 8) !=
            uVar23)) goto LAB_0010d971;
        uVar23 = *(uint *)((long)blk + 0xe);
        uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18
        ;
        lVar17 = -6;
        do {
          if (*(char *)((long)blk + lVar17 + 0x18) != '\0') goto LAB_0010d971;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0);
        bVar8 = false;
        tVar18 = time((time_t *)0x0);
        if (((ulong)uVar23 - tVar18) - 0x4b1 < 0xfffffffffffff69f) {
          pcVar22 = "XDM-AUTHORIZATION-1 time stamp was too far out";
        }
        else {
          puVar20 = (uint *)safemalloc(1,0xc,0);
          *puVar20 = uVar23;
          *(undefined2 *)(puVar20 + 2) = *(undefined2 *)((long)blk + 0xc);
          puVar20[1] = *(uint *)(blk + 1);
          if (*(tree234 **)(piVar16 + 0xc) == (tree234 *)0x0) {
            __assert_fail("auth->xdmseen != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                          ,0xf0,
                          "const char *x11_verify(unsigned long, int, tree234 *, char *, unsigned char *, int, struct X11FakeAuth **)"
                         );
          }
          puVar21 = (uint *)add234(*(tree234 **)(piVar16 + 0xc),puVar20);
          if (puVar21 != puVar20) {
            safefree(puVar20);
            pcVar22 = "XDM-AUTHORIZATION-1 data replayed";
            goto LAB_0010d971;
          }
          while( true ) {
            pcVar22 = (char *)0x0;
            puVar20 = (uint *)index234(*(tree234 **)(piVar16 + 0xc),0);
            if (puVar20 == (uint *)0x0) {
              __assert_fail("seen != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                            ,0xf9,
                            "const char *x11_verify(unsigned long, int, tree234 *, char *, unsigned char *, int, struct X11FakeAuth **)"
                           );
            }
            if ((ulong)uVar23 - (ulong)*puVar20 < 0x4b1) break;
            pvVar13 = delpos234(*(tree234 **)(piVar16 + 0xc),0);
            safefree(pvVar13);
          }
          bVar8 = true;
        }
      }
      else {
        pcVar22 = "XDM-AUTHORIZATION-1 data was wrong length";
LAB_0010d971:
        bVar8 = false;
      }
      if (!bVar8) goto LAB_0010d97d;
    }
    pcVar22 = (char *)0x0;
  }
  else {
    iVar10 = strcmp((char *)__s1,"XDM-AUTHORIZATION-1");
    if (iVar10 == 0) {
      puVar15 = local_58;
      local_80[0] = 2;
      goto LAB_0010d873;
    }
    pcVar22 = "Unsupported authorisation protocol";
LAB_0010d97d:
    piVar16 = (int *)0x0;
  }
  if (pcVar22 == (char *)0x0) {
    if (piVar16 == (int *)0x0) {
      __assert_fail("auth_matched",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                    ,0x21b,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
    }
    iVar24 = (uint)bVar4 * 0x100 + (uint)bVar3;
    iVar10 = (uint)bVar6 * 0x100 + (uint)bVar5;
    if (*(long *)(piVar16 + 0x10) == 0) {
      chan->initial_fixed_window_size = 0;
      (**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 0x28))();
      lVar17 = *(long *)(piVar16 + 0xe);
      *(long *)&chan[-6].initial_fixed_window_size = lVar17;
      addr = sk_addr_dup(*(SockAddr **)(lVar17 + 0x20));
      pcVar22 = *(char **)(*(long *)&chan[-6].initial_fixed_window_size + 0x30);
      port = *(int *)(*(long *)&chan[-6].initial_fixed_window_size + 0x28);
      conf = (Conf *)(**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 0x20))();
      pCVar12 = (ChannelVtable *)
                new_connection(addr,pcVar22,port,false,true,false,false,
                               (Plug *)&chan[-1].initial_fixed_window_size,conf,(Interactor *)0x0);
      chan[-1].vt = pCVar12;
      pcVar22 = (*((SocketVtable *)pCVar12->free)->socket_error)((Socket *)pCVar12);
      if (pcVar22 == (char *)0x0) {
        socketdatalen = 0;
        pbVar19 = (byte *)sk_getxdmdata((Socket *)chan[-1].vt,&socketdatalen);
        if ((pbVar19 == (byte *)0x0) || (socketdatalen != 6)) {
          builtin_strncpy(new_peer_addr,"0.0.0.0",8);
          uVar23 = 0;
        }
        else {
          sprintf(new_peer_addr,"%d.%d.%d.%d",(ulong)*pbVar19,(ulong)pbVar19[1],(ulong)pbVar19[2],
                  (ulong)pbVar19[3]);
          uVar23 = (uint)(ushort)(*(ushort *)(pbVar19 + 4) << 8 | *(ushort *)(pbVar19 + 4) >> 8);
        }
        lVar17 = *(long *)&chan[-6].initial_fixed_window_size;
        pvVar13 = x11_make_greeting((uint)*(byte *)&chan[-7].vt,iVar24,iVar10,
                                    *(int *)(lVar17 + 0x38),*(void **)(lVar17 + 0x40),
                                    *(int *)(lVar17 + 0x48),new_peer_addr,uVar23,&greeting_len);
        (**(code **)((chan[-1].vt)->free + 0x10))(chan[-1].vt,pvVar13,(long)greeting_len);
        smemclr(pvVar13,(long)greeting_len);
        safefree(pvVar13);
        *(undefined1 *)((long)&chan[-3].vt + 4) = 1;
LAB_0010d767:
        sVar14 = (**(code **)((chan[-1].vt)->free + 0x10))(chan[-1].vt,vdata,len);
        return sVar14;
      }
      pcVar22 = dupprintf("unable to connect to forwarded X server: %s",pcVar22);
      x11_send_init_error((X11Connection_conflict *)(chan + -7),pcVar22);
      safefree(pcVar22);
    }
    else {
      (**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 0x30))
                (*(long **)&chan[-2].initial_fixed_window_size,*(long *)(piVar16 + 0x10),
                 *(undefined8 *)(piVar16 + 0x12),*(undefined8 *)&chan[-3].initial_fixed_window_size,
                 *(undefined4 *)&chan[-2].vt,*(undefined1 *)&chan[-7].vt,iVar24,iVar10,vdata,len);
    }
  }
  else {
    x11_send_init_error((X11Connection_conflict *)(chan + -7),pcVar22);
  }
  return 0;
}

Assistant:

static size_t x11_send(
    Channel *chan, bool is_stderr, const void *vdata, size_t len)
{
    assert(chan->vt == &X11Connection_channelvt);
    X11Connection *xconn = container_of(chan, X11Connection, chan);
    const char *data = (const char *)vdata;

    /*
     * Read the first packet.
     */
    while (len > 0 && xconn->data_read < 12)
        xconn->firstpkt[xconn->data_read++] = (unsigned char) (len--, *data++);
    if (xconn->data_read < 12)
        return 0;

    /*
     * If we have not allocated the auth_protocol and auth_data
     * strings, do so now.
     */
    if (!xconn->auth_protocol) {
        char endian = xconn->firstpkt[0];
        xconn->auth_plen = GET_16BIT_X11(endian, xconn->firstpkt + 6);
        xconn->auth_dlen = GET_16BIT_X11(endian, xconn->firstpkt + 8);
        xconn->auth_psize = (xconn->auth_plen + 3) & ~3;
        xconn->auth_dsize = (xconn->auth_dlen + 3) & ~3;
        /* Leave room for a terminating zero, to make our lives easier. */
        xconn->auth_protocol = snewn(xconn->auth_psize + 1, char);
        xconn->auth_data = snewn(xconn->auth_dsize, unsigned char);
    }

    /*
     * Read the auth_protocol and auth_data strings.
     */
    while (len > 0 &&
           xconn->data_read < 12 + xconn->auth_psize)
        xconn->auth_protocol[xconn->data_read++ - 12] = (len--, *data++);
    while (len > 0 &&
           xconn->data_read < 12 + xconn->auth_psize + xconn->auth_dsize)
        xconn->auth_data[xconn->data_read++ - 12 -
                      xconn->auth_psize] = (unsigned char) (len--, *data++);
    if (xconn->data_read < 12 + xconn->auth_psize + xconn->auth_dsize)
        return 0;

    /*
     * If we haven't verified the authorisation, do so now.
     */
    if (!xconn->verified) {
        const char *err;
        struct X11FakeAuth *auth_matched = NULL;
        unsigned long peer_ip;
        int peer_port;
        int protomajor, protominor;
        void *greeting;
        int greeting_len;
        unsigned char *socketdata;
        int socketdatalen;
        char new_peer_addr[32];
        int new_peer_port;
        char endian = xconn->firstpkt[0];

        protomajor = GET_16BIT_X11(endian, xconn->firstpkt + 2);
        protominor = GET_16BIT_X11(endian, xconn->firstpkt + 4);

        assert(!xconn->s);

        xconn->auth_protocol[xconn->auth_plen] = '\0';  /* ASCIZ */

        peer_ip = 0;                   /* placate optimiser */
        if (x11_parse_ip(xconn->peer_addr, &peer_ip))
            peer_port = xconn->peer_port;
        else
            peer_port = -1; /* signal no peer address data available */

        err = x11_verify(peer_ip, peer_port,
                         xconn->authtree, xconn->auth_protocol,
                         xconn->auth_data, xconn->auth_dlen, &auth_matched);
        if (err) {
            x11_send_init_error(xconn, err);
            return 0;
        }
        assert(auth_matched);

        /*
         * If this auth points to a connection-sharing downstream
         * rather than an X display we know how to connect to
         * directly, pass it off to the sharing module now. (This will
         * have the side effect of freeing xconn.)
         */
        if (auth_matched->share_cs) {
            sshfwd_x11_sharing_handover(xconn->c, auth_matched->share_cs,
                                        auth_matched->share_chan,
                                        xconn->peer_addr, xconn->peer_port,
                                        xconn->firstpkt[0],
                                        protomajor, protominor, data, len);
            return 0;
        }

        /*
         * Now we know we're going to accept the connection, and what
         * X display to connect to. Actually connect to it.
         */
        xconn->chan.initial_fixed_window_size = 0;
        sshfwd_window_override_removed(xconn->c);
        xconn->disp = auth_matched->disp;
        xconn->s = new_connection(sk_addr_dup(xconn->disp->addr),
                                  xconn->disp->realhost, xconn->disp->port,
                                  false, true, false, false, &xconn->plug,
                                  sshfwd_get_conf(xconn->c), NULL);
        if ((err = sk_socket_error(xconn->s)) != NULL) {
            char *err_message = dupprintf("unable to connect to"
                                          " forwarded X server: %s", err);
            x11_send_init_error(xconn, err_message);
            sfree(err_message);
            return 0;
        }

        /*
         * Write a new connection header containing our replacement
         * auth data.
         */
        socketdatalen = 0;             /* placate compiler warning */
        socketdata = sk_getxdmdata(xconn->s, &socketdatalen);
        if (socketdata && socketdatalen==6) {
            sprintf(new_peer_addr, "%d.%d.%d.%d", socketdata[0],
                    socketdata[1], socketdata[2], socketdata[3]);
            new_peer_port = GET_16BIT_MSB_FIRST(socketdata + 4);
        } else {
            strcpy(new_peer_addr, "0.0.0.0");
            new_peer_port = 0;
        }

        greeting = x11_make_greeting(xconn->firstpkt[0],
                                     protomajor, protominor,
                                     xconn->disp->localauthproto,
                                     xconn->disp->localauthdata,
                                     xconn->disp->localauthdatalen,
                                     new_peer_addr, new_peer_port,
                                     &greeting_len);

        sk_write(xconn->s, greeting, greeting_len);

        smemclr(greeting, greeting_len);
        sfree(greeting);

        /*
         * Now we're done.
         */
        xconn->verified = true;
    }

    /*
     * After initialisation, just copy data simply.
     */

    return sk_write(xconn->s, data, len);
}